

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# orphan-test.c++
# Opt level: O3

void __thiscall capnp::_::anon_unknown_0::TestCase267::run(TestCase267 *this)

{
  Orphanage OVar1;
  OrphanBuilder local_188;
  Builder root;
  bool local_140;
  ArrayPtr<const_char> local_138;
  WirePointer *local_128;
  Builder local_118;
  MallocMessageBuilder builder;
  
  MallocMessageBuilder::MallocMessageBuilder(&builder,0x400,GROW_HEURISTICALLY);
  OVar1 = MessageBuilder::getOrphanage(&builder.super_MessageBuilder);
  OrphanBuilder::copy((EVP_PKEY_CTX *)&root,(EVP_PKEY_CTX *)OVar1.arena);
  local_188.segment = (SegmentBuilder *)root._builder.capTable;
  local_188.capTable = (CapTableBuilder *)root._builder.data;
  local_188.location = (word *)root._builder.pointers;
  local_188.tag.content = (uint64_t)root._builder.segment;
  local_118.builder.segment = (SegmentBuilder *)0x2a99ed;
  local_138 = (ArrayPtr<const_char>)OrphanBuilder::asTextReader(&local_188);
  kj::_::DebugExpression<char_const(&)[9]>::operator==
            ((DebugComparison<const_char_(&)[9],_capnp::Text::Reader> *)&root,
             (DebugExpression<char_const(&)[9]> *)&local_118,(Reader *)&local_138);
  if ((local_140 == false) && (kj::_::Debug::minSeverity < 3)) {
    local_138 = (ArrayPtr<const_char>)OrphanBuilder::asTextReader(&local_188);
    kj::_::Debug::
    log<char_const(&)[54],kj::_::DebugComparison<char_const(&)[9],capnp::Text::Reader>&,char_const(&)[9],capnp::Text::Reader>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/orphan-test.c++"
               ,0x10f,ERROR,
               "\"failed: expected \" \"(\\\"foobarba\\\") == (orphan.getReader())\", _kjCondition, \"foobarba\", orphan.getReader()"
               ,(char (*) [54])"failed: expected (\"foobarba\") == (orphan.getReader())",
               (DebugComparison<const_char_(&)[9],_capnp::Text::Reader> *)&root,
               (char (*) [9])"foobarba",(Reader *)&local_138);
  }
  MessageBuilder::getRootInternal(&local_118,&builder.super_MessageBuilder);
  local_128 = local_118.builder.pointer;
  local_138.ptr = (char *)local_118.builder.segment;
  PointerBuilder::initStruct(&root._builder,(PointerBuilder *)&local_138,(StructSize)0x140006);
  local_128 = root._builder.pointers;
  PointerBuilder::adopt((PointerBuilder *)&local_138,&local_188);
  if (local_188.segment != (SegmentBuilder *)0x0) {
    OrphanBuilder::euthanize(&local_188);
  }
  MallocMessageBuilder::~MallocMessageBuilder(&builder);
  return;
}

Assistant:

TEST(Orphans, OrphanageTextCopy) {
  MallocMessageBuilder builder;

  Orphan<Text> orphan = builder.getOrphanage().newOrphanCopy(Text::Reader("foobarba"));
  EXPECT_EQ("foobarba", orphan.getReader());

  auto root = builder.initRoot<TestAllTypes>();
  root.adoptTextField(kj::mv(orphan));
}